

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbscreen.cpp
# Opt level: O3

Format __thiscall QXcbScreen::format(QXcbScreen *this)

{
  uint8_t depth;
  QXcbConnection *connection;
  long lVar1;
  Format FVar2;
  const_iterator cVar3;
  const_iterator cVar4;
  xcb_visualtype_t *visual;
  long in_FS_OFFSET;
  bool needsRgbSwap;
  Format format;
  bool local_39;
  Format local_38;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xaaaaaaaa;
  local_39 = true;
  connection = *(QXcbConnection **)(this + 0x10);
  lVar1 = *(long *)(this + 0x20);
  depth = *(uint8_t *)(*(long *)(lVar1 + 8) + 0x26);
  local_34 = *(uint *)(*(long *)(lVar1 + 8) + 0x20);
  cVar3 = QMap<unsigned_int,_xcb_visualtype_t>::find
                    ((QMap<unsigned_int,_xcb_visualtype_t> *)(lVar1 + 0x78),&local_34);
  cVar4._M_node = *(_Base_ptr *)(lVar1 + 0x78);
  if (cVar4._M_node != (_Base_ptr)0x0) {
    cVar4._M_node = (_Base_ptr)&(cVar4._M_node)->_M_left;
  }
  visual = (xcb_visualtype_t *)0x0;
  if (cVar3.i._M_node != (const_iterator)cVar4._M_node) {
    visual = (xcb_visualtype_t *)((long)cVar3.i._M_node + 0x24);
  }
  qt_xcb_imageFormatForVisual(connection,depth,visual,&local_38,&local_39);
  FVar2 = Format_RGB32;
  if (local_38 != Format_Invalid) {
    FVar2 = local_38;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return FVar2;
  }
  __stack_chk_fail();
}

Assistant:

QImage::Format QXcbScreen::format() const
{
    QImage::Format format;
    bool needsRgbSwap;
    qt_xcb_imageFormatForVisual(connection(), screen()->root_depth, visualForId(screen()->root_visual), &format, &needsRgbSwap);
    // We are ignoring needsRgbSwap here and just assumes the backing-store will handle it.
    if (format != QImage::Format_Invalid)
        return format;
    return QImage::Format_RGB32;
}